

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O2

void DiffTestRecurse<Blob<128>,unsigned_long>
               (pfHash hash,Blob<128> *k1,Blob<128> *k2,unsigned_long *h1,unsigned_long *h2,
               int start,int bitsleft,vector<Blob<128>,_std::allocator<Blob<128>_>_> *diffs)

{
  Blob<128> local_40;
  
  while (start < 0x80) {
    flipbit(k2,0x10,start);
    (*hash)(k2,0x10,0,h2);
    if (*h1 == *h2) {
      Blob<128>::operator^(&local_40,k1);
      std::vector<Blob<128>,std::allocator<Blob<128>>>::emplace_back<Blob<128>>
                ((vector<Blob<128>,std::allocator<Blob<128>>> *)diffs,&local_40);
    }
    if (bitsleft + -1 != 0) {
      DiffTestRecurse<Blob<128>,unsigned_long>(hash,k1,k2,h1,h2,start + 1U,bitsleft + -1,diffs);
    }
    flipbit(k2,0x10,start);
    start = start + 1U;
  }
  return;
}

Assistant:

void DiffTestRecurse ( pfHash hash, keytype & k1, keytype & k2, hashtype & h1, hashtype & h2, int start, int bitsleft, std::vector<keytype> & diffs )
{
  const int bits = sizeof(keytype)*8;

  for(int i = start; i < bits; i++)
  {
    flipbit(&k2,sizeof(k2),i);
    bitsleft--;

    hash(&k2,sizeof(k2),0,&h2);

    if(h1 == h2)
    {
      diffs.push_back(k1 ^ k2);
    }

    if(bitsleft)
    {
      DiffTestRecurse(hash,k1,k2,h1,h2,i+1,bitsleft,diffs);
    }

    flipbit(&k2,sizeof(k2),i);
    bitsleft++;
  }
}